

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O3

double __thiscall
fasttext::Autotune::getMetricScore
          (Autotune *this,Meter *meter,metric_name *metricName,double metricValue,
          string *metricLabel)

{
  int32_t labelId;
  runtime_error *this_00;
  double dVar1;
  
  if (metricLabel->_M_string_length == 0) {
    labelId = -1;
  }
  else {
    labelId = FastText::getLabelId(this->fastText_,metricLabel);
    if (labelId == -1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unknown autotune metric label");
      goto LAB_0010f10c;
    }
  }
  switch(*metricName) {
  case f1score:
    dVar1 = Meter::f1Score(meter);
    return dVar1;
  case f1scoreLabel:
    dVar1 = Meter::f1Score(meter,labelId);
    return dVar1;
  case precisionAtRecall:
    dVar1 = Meter::precisionAtRecall(meter,metricValue);
    return dVar1;
  case precisionAtRecallLabel:
    dVar1 = Meter::precisionAtRecall(meter,labelId,metricValue);
    return dVar1;
  case recallAtPrecision:
    dVar1 = Meter::recallAtPrecision(meter,metricValue);
    return dVar1;
  case recallAtPrecisionLabel:
    dVar1 = Meter::recallAtPrecision(meter,labelId,metricValue);
    return dVar1;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown metric");
  }
LAB_0010f10c:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double Autotune::getMetricScore(
    Meter& meter,
    const metric_name& metricName,
    const double metricValue,
    const std::string& metricLabel) const {
  double score = 0.0;
  int32_t labelId = -1;
  if (!metricLabel.empty()) {
    labelId = fastText_->getLabelId(metricLabel);
    if (labelId == -1) {
      throw std::runtime_error("Unknown autotune metric label");
    }
  }
  if (metricName == metric_name::f1score) {
    score = meter.f1Score();
  } else if (metricName == metric_name::f1scoreLabel) {
    score = meter.f1Score(labelId);
  } else if (metricName == metric_name::precisionAtRecall) {
    score = meter.precisionAtRecall(metricValue);
  } else if (metricName == metric_name::precisionAtRecallLabel) {
    score = meter.precisionAtRecall(labelId, metricValue);
  } else if (metricName == metric_name::recallAtPrecision) {
    score = meter.recallAtPrecision(metricValue);
  } else if (metricName == metric_name::recallAtPrecisionLabel) {
    score = meter.recallAtPrecision(labelId, metricValue);
  } else {
    throw std::runtime_error("Unknown metric");
  }
  return score;
}